

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkPrintDistrib(Wlc_Ntk_t *p,int fTwoSides,int fVerbose)

{
  Abc_Nam_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Wrd_t *pVVar6;
  Wlc_Obj_t *pWVar7;
  char *pcVar8;
  Vec_Wrd_t *p_03;
  word wVar9;
  double dVar10;
  int local_4a4;
  int local_2e0 [15];
  int local_2a4;
  int local_29c;
  int nTotal;
  Vec_Wrd_t *vOccur;
  Vec_Wrd_t *vType;
  int local_240;
  int s1;
  int s0;
  int s;
  int k;
  int i;
  word Sign;
  Vec_Int_t *vAnds;
  Vec_Ptr_t *vOccurs;
  Vec_Ptr_t *vTypes;
  Wlc_Obj_t *pWStack_208;
  int nCountRange;
  Wlc_Obj_t *pObjRange;
  Wlc_Obj_t *pObj;
  int nObjs [2] [60];
  int fVerbose_local;
  int fTwoSides_local;
  Wlc_Ntk_t *p_local;
  
  nObjs[1][0x3a] = fVerbose;
  nObjs[1][0x3b] = fTwoSides;
  memset(&pObj,0,0x1e0);
  pWStack_208 = (Wlc_Obj_t *)0x0;
  vTypes._4_4_ = 0;
  Sign = (word)Vec_IntStart(0x3c);
  _k = 0;
  iVar1 = Wlc_NtkPoNum(p);
  if (iVar1 != 2) {
    nObjs[1][0x3b] = 0;
  }
  if (nObjs[1][0x3b] != 0) {
    Wlc_NtkCollectStats(p,(int (*) [60])&pObj);
  }
  vOccurs = Vec_PtrStart(0x3c);
  vAnds = (Vec_Int_t *)Vec_PtrStart(0x3c);
  for (s = 0; p_02 = vOccurs, iVar1 = s, s < 0x3c; s = s + 1) {
    pVVar6 = Vec_WrdAlloc(0x10);
    Vec_PtrWriteEntry(p_02,iVar1,pVVar6);
  }
  for (s = 0; p_01 = vAnds, iVar1 = s, s < 0x3c; s = s + 1) {
    pVVar6 = Vec_WrdAlloc(0x10);
    Vec_PtrWriteEntry((Vec_Ptr_t *)p_01,iVar1,pVVar6);
  }
  s = 1;
  do {
    iVar1 = s;
    iVar2 = Wlc_NtkObjNumMax(p);
    if (iVar2 <= iVar1) {
      if ((vTypes._4_4_ != 0) && (iVar1 = Vec_IntSize(&p->vNameIds), 0 < iVar1)) {
        printf("Warning: %d objects of the design have non-zero-based ranges.\n",(ulong)vTypes._4_4_
              );
        uVar4 = Wlc_ObjId(p,pWStack_208);
        p_00 = p->pManName;
        iVar1 = Wlc_ObjId(p,pWStack_208);
        iVar1 = Wlc_ObjNameId(p,iVar1);
        pcVar8 = Abc_NamStr(p_00,iVar1);
        uVar5 = Wlc_ObjRange(pWStack_208);
        printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",(ulong)uVar4,
               pcVar8,(ulong)uVar5,(ulong)(uint)pWStack_208->End,(ulong)(uint)pWStack_208->Beg);
      }
      pcVar8 = "";
      if (nObjs[1][0x3b] != 0) {
        pcVar8 = "     Left Share Right";
      }
      printf("ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n"
             ,pcVar8);
      for (s = 0; s < 0x3c; s = s + 1) {
        pVVar6 = (Vec_Wrd_t *)Vec_PtrEntry(vOccurs,s);
        p_03 = (Vec_Wrd_t *)Vec_PtrEntry((Vec_Ptr_t *)vAnds,s);
        if (p->nObjs[s] != 0) {
          printf("%2d  :  %-8s  %6d",(ulong)(uint)s,Wlc_Names[s],(ulong)(uint)p->nObjs[s]);
          if (nObjs[1][0x3b] != 0) {
            if (s == 1) {
              local_4a4 = Wlc_NtkCountRealPis(p);
            }
            else {
              local_4a4 = p->nObjs[s];
            }
            printf("   ");
            printf("%6d",(ulong)(uint)nObjs[-1][(long)s + 0x3a]);
            printf("%6d",(ulong)(uint)((nObjs[-1][(long)s + 0x3a] + nObjs[0][(long)s + 0x3a]) -
                                      local_4a4));
            printf("%6d",(ulong)(uint)nObjs[0][(long)s + 0x3a]);
          }
          uVar4 = Vec_IntEntry((Vec_Int_t *)Sign,s);
          printf("%8d ",(ulong)uVar4);
          Wlc_NtkPrintDistribSortOne(vOccurs,(Vec_Ptr_t *)vAnds,s);
          for (s0 = 0; iVar1 = s0, iVar2 = Vec_WrdSize(pVVar6), iVar1 < iVar2; s0 = s0 + 1) {
            _k = Vec_WrdEntry(pVVar6,s0);
            Wlc_NtkPrintDistribFromSign(_k,&s1,&local_240,(int *)((long)&vType + 4));
            if ((((s0 % 6 == 5) && (vType._4_4_ != 0)) || ((s0 % 8 == 7 && (vType._4_4_ == 0)))) &&
               (printf("\n                                "), nObjs[1][0x3b] != 0)) {
              printf("                     ");
            }
            wVar9 = Vec_WrdEntry(p_03,s0);
            printf("(%d)",wVar9 & 0xffffffff);
            iVar1 = Abc_LitIsCompl(s1);
            pcVar8 = "";
            if (iVar1 != 0) {
              pcVar8 = "-";
            }
            uVar4 = Abc_Lit2Var(s1);
            printf("%s%d",pcVar8,(ulong)uVar4);
            if (local_240 != 0) {
              iVar1 = Abc_LitIsCompl(local_240);
              pcVar8 = "";
              if (iVar1 != 0) {
                pcVar8 = "-";
              }
              uVar4 = Abc_Lit2Var(local_240);
              printf("=%s%d",pcVar8,(ulong)uVar4);
            }
            if (vType._4_4_ != 0) {
              iVar1 = Abc_LitIsCompl(vType._4_4_);
              pcVar8 = "";
              if (iVar1 != 0) {
                pcVar8 = "-";
              }
              uVar4 = Abc_Lit2Var(vType._4_4_);
              printf(".%s%d",pcVar8,(ulong)uVar4);
            }
            printf(" ");
          }
          printf("\n");
        }
      }
      Vec_VecFree((Vec_Vec_t *)vOccurs);
      Vec_VecFree((Vec_Vec_t *)vAnds);
      Vec_IntFree((Vec_Int_t *)Sign);
      return;
    }
    pObjRange = Wlc_NtkObj(p,s);
    iVar2 = Wlc_ObjSign(pObjRange);
    iVar1 = s;
    if (0x1fffff < iVar2) {
      uVar4 = Wlc_ObjRange(pObjRange);
      uVar5 = Wlc_ObjRange(pObjRange);
      printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
             (ulong)(uint)iVar1,(ulong)uVar4,(ulong)(uVar5 & 0xfffff));
    }
    if (pObjRange->Beg != 0) {
      if (pWStack_208 == (Wlc_Obj_t *)0x0) {
        pWStack_208 = pObjRange;
      }
      vTypes._4_4_ = vTypes._4_4_ + 1;
    }
    iVar1 = Wlc_ObjIsCi(pObjRange);
    if (((iVar1 == 0) &&
        ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) !=
         (undefined1  [24])0x6)) &&
       ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x17)) {
      if (((((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x7) ||
           ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x16)) ||
          ((((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x35 ||
            (((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x18 ||
             ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x19)))) ||
           ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
            (undefined1  [24])0xf)))) ||
         (((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x1a ||
          ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x32)))) {
        iVar1 = Wlc_ObjSign(pObjRange);
        pWVar7 = Wlc_ObjFanin0(p,pObjRange);
        iVar2 = Wlc_ObjSign(pWVar7);
        _k = Wlc_NtkPrintDistribMakeSign(iVar1,iVar2,0);
      }
      else {
        iVar2 = Wlc_ObjFaninNum(pObjRange);
        iVar1 = s;
        if (iVar2 == 0) {
          pcVar8 = Wlc_ObjName(p,s);
          printf("Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n"
                 ,(ulong)(uint)iVar1,pcVar8);
        }
        else {
          iVar1 = Wlc_ObjFaninNum(pObjRange);
          if (iVar1 == 1) {
            iVar1 = Wlc_ObjSign(pObjRange);
            pWVar7 = Wlc_ObjFanin0(p,pObjRange);
            iVar2 = Wlc_ObjSign(pWVar7);
            _k = Wlc_NtkPrintDistribMakeSign(iVar1,iVar2,0);
          }
          else {
            iVar1 = Wlc_ObjFaninNum(pObjRange);
            if (iVar1 < 2) {
              __assert_fail("Wlc_ObjFaninNum(pObj) >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                            ,0x22d,"void Wlc_NtkPrintDistrib(Wlc_Ntk_t *, int, int)");
            }
            iVar1 = Wlc_ObjSign(pObjRange);
            iVar2 = Wlc_ObjFaninId(pObjRange,0);
            if (iVar2 == 0) {
              local_29c = 0;
            }
            else {
              pWVar7 = Wlc_ObjFanin0(p,pObjRange);
              local_29c = Wlc_ObjSign(pWVar7);
            }
            iVar2 = Wlc_ObjFaninId(pObjRange,1);
            if (iVar2 == 0) {
              local_2a4 = 0;
            }
            else {
              pWVar7 = Wlc_ObjFanin1(p,pObjRange);
              local_2a4 = Wlc_ObjSign(pWVar7);
            }
            _k = Wlc_NtkPrintDistribMakeSign(iVar1,local_29c,local_2a4);
          }
        }
      }
    }
    else {
      iVar1 = Wlc_ObjSign(pObjRange);
      _k = Wlc_NtkPrintDistribMakeSign(iVar1,0,0);
    }
    Wlc_NtkPrintDistribAddOne(vOccurs,(Vec_Ptr_t *)vAnds,(uint)(*(ushort *)pObjRange & 0x3f),_k);
    wVar9 = Sign;
    if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x8) {
      iVar1 = Wlc_ObjRange(pObjRange);
      iVar2 = Wlc_ObjFaninNum(pObjRange);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,8,iVar1 * 3 * (iVar2 + -2));
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x9) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      uVar4 = Wlc_ObjRange(pObjRange);
      iVar2 = Abc_Base2Log(uVar4);
      iVar1 = Abc_MinInt(iVar1,iVar2);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,9,iVar1 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0xa) {
      iVar1 = Wlc_ObjRange(pObjRange);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      uVar4 = Wlc_ObjRange(pObjRange);
      iVar3 = Abc_Base2Log(uVar4);
      iVar2 = Abc_MinInt(iVar2,iVar3);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,10,iVar1 * iVar2 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0xb) {
      iVar1 = Wlc_ObjRange(pObjRange);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      uVar4 = Wlc_ObjRange(pObjRange);
      iVar3 = Abc_Base2Log(uVar4);
      iVar2 = Abc_MinInt(iVar2,iVar3);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0xb,iVar1 * iVar2 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0xc) {
      iVar1 = Wlc_ObjRange(pObjRange);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      uVar4 = Wlc_ObjRange(pObjRange);
      iVar3 = Abc_Base2Log(uVar4);
      iVar2 = Abc_MinInt(iVar2,iVar3);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0xc,iVar1 * iVar2 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0xd) {
      iVar1 = Wlc_ObjRange(pObjRange);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      uVar4 = Wlc_ObjRange(pObjRange);
      iVar3 = Abc_Base2Log(uVar4);
      iVar2 = Abc_MinInt(iVar2,iVar3);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0xd,iVar1 * iVar2 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0xe) {
      iVar1 = Wlc_ObjRange(pObjRange);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      uVar4 = Wlc_ObjRange(pObjRange);
      iVar3 = Abc_Base2Log(uVar4);
      iVar2 = Abc_MinInt(iVar2,iVar3);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0xe,iVar1 * iVar2 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0xf) {
      Vec_IntAddToEntry((Vec_Int_t *)Sign,0xf,0);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x10) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x10,iVar1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x11) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x11,iVar1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x12) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x12,iVar1 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x13) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x13,iVar1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x14) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x14,iVar1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x15) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x15,iVar1 * 3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x16) {
      Vec_IntAddToEntry((Vec_Int_t *)Sign,0x16,0);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x17) {
      Vec_IntAddToEntry((Vec_Int_t *)Sign,0x17,0);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x18) {
      Vec_IntAddToEntry((Vec_Int_t *)Sign,0x18,0);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x19) {
      Vec_IntAddToEntry((Vec_Int_t *)Sign,0x19,0);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x1a) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x1a,iVar1 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x1b) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin1(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x1b,iVar1 + iVar2 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x1c) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin1(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x1c,iVar1 + iVar2 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x1d) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin1(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x1d,iVar1 + iVar2 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x1e) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin1(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x1e,iVar1 + iVar2 + 1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x1f) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x1f,iVar1 * 4 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x20) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x20,iVar1 * 4 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x21) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x21,iVar1 * 6 + -6);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x22) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x22,iVar1 * 6 + -6);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x23) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x23,iVar1 * 6 + -6);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x24) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x24,iVar1 * 6 + -6);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x25) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x25,iVar1 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x26) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x26,iVar1 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x27) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x27,iVar1 * 3 + -3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x28) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x28,iVar1 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x29) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x29,iVar1 + -1);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x2a) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x2a,iVar1 * 3 + -3);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x2b) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x2b,iVar1 * 9);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x2c) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x2c,iVar1 * 9);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x2d) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin1(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x2d,iVar1 * 9 * iVar2);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x2e) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar3 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x2e,iVar1 * 0xd * iVar2 + iVar3 * -0x13 + 10);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x2f) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar3 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x2f,iVar1 * 0xd * iVar2 + iVar3 * -7 + -2);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x30) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar3 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x30,iVar1 * 0xd * iVar2 + iVar3 * -7 + -2);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x31) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      dVar10 = pow((double)iVar1,(double)iVar2);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x31,(int)dVar10 * 10);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x32) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x32,iVar1 << 2);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x33) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar3 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x33,(iVar1 * 0xb * iVar2) / 8 + (iVar3 * 5) / 2 + -5);
    }
    else if ((undefined1  [24])((undefined1  [24])*pObjRange & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x34) {
      pWVar7 = Wlc_ObjFanin0(p,pObjRange);
      iVar1 = Wlc_ObjRange(pWVar7);
      pWVar7 = Wlc_ObjFanin1(p,pObjRange);
      iVar2 = Wlc_ObjRange(pWVar7);
      Vec_IntAddToEntry((Vec_Int_t *)wVar9,0x34,iVar1 * 5 * iVar2);
    }
    s = s + 1;
  } while( true );
}

Assistant:

void Wlc_NtkPrintDistrib( Wlc_Ntk_t * p, int fTwoSides, int fVerbose )
{
    int nObjs[2][WLC_OBJ_NUMBER] = {{0}}; // counter of objects of each type
    Wlc_Obj_t * pObj, * pObjRange = NULL; int nCountRange = 0;
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( WLC_OBJ_NUMBER );
    word Sign = 0;
    int i, k, s, s0, s1;
    if ( Wlc_NtkPoNum(p) != 2 )
        fTwoSides = 0;
    if ( fTwoSides )
        Wlc_NtkCollectStats( p, nObjs );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( WLC_OBJ_NUMBER );
    vOccurs = Vec_PtrStart( WLC_OBJ_NUMBER );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Wlc_NtkForEachObj( p, pObj, i )
    {
//        char * pName = Wlc_ObjName(p, i);
        if ( Wlc_ObjSign(pObj) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Wlc_ObjRange(pObj), Wlc_ObjRange(pObj) & 0xFFFFF );
        if ( pObj->Beg )
        {
            if ( pObjRange == NULL )
                pObjRange = pObj;
            nCountRange++;
        }
        // 0-input types
        if ( Wlc_ObjIsCi(pObj) || pObj->Type == WLC_OBJ_CONST || pObj->Type == WLC_OBJ_BIT_CONCAT )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), 0, 0 );
        // 1-input types
        else if ( pObj->Type == WLC_OBJ_BUF    || pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_TABLE ||
             pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT || 
             pObj->Type == WLC_OBJ_BIT_NOT     || pObj->Type == WLC_OBJ_LOGIC_NOT   || pObj->Type == WLC_OBJ_ARI_MINUS )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        // 2-input types (including MUX)
        else if ( Wlc_ObjFaninNum(pObj) == 0 )
            printf( "Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n", i, Wlc_ObjName(p, i) );
        else if ( Wlc_ObjFaninNum(pObj) == 1 )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        else
        {
            assert( Wlc_ObjFaninNum(pObj) >= 2 );
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjFaninId(pObj, 0) ? Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)) : 0, Wlc_ObjFaninId(pObj, 1) ? Wlc_ObjSign(Wlc_ObjFanin1(p, pObj)) : 0 );
        }
        // add to storage
        Wlc_NtkPrintDistribAddOne( vTypes, vOccurs, pObj->Type, Sign );
        // count the number of AIG nodes
        if ( pObj->Type == WLC_OBJ_MUX )
            Vec_IntAddToEntry( vAnds, WLC_OBJ_MUX,      3 * Wlc_ObjRange(pObj) * (Wlc_ObjFaninNum(pObj) - 2) );
        else if ( pObj->Type == WLC_OBJ_SHIFT_R )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_R,  Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_RA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_RA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_L )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_L,  Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_LA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_LA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_R )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_R, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_L )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_L, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_BIT_NOT )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_AND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_AND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_OR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_OR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_XOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_XOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NAND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NAND,     Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NOR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOR,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NXOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NXOR, 3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_SELECT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SELECT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_CONCAT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_CONCAT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_ZEROPAD )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_ZEROPAD, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_SIGNEXT )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SIGNEXT, 0 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_NOT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_NOT,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_IMPL )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_IMPL,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_AND )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_AND,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_OR )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_OR,         Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_XOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_XOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) + 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_EQU )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_EQU,     4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_NOTEQU )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_NOTEQU,  4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESS )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESS,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MORE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MORE,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESSEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESSEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MOREEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MOREEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_AND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_AND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_OR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_OR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_XOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_XOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NAND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NAND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NOR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NXOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NXOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_ARI_ADD )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_ADD,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SUB )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SUB,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MULTI,    9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_DIVIDE )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_DIVIDE,  13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 19 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + 10 );
        else if ( pObj->Type == WLC_OBJ_ARI_REM )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_REM,     13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_MODULUS )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MODULUS, 13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_POWER ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_POWER,   10 * (int)pow((double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)),(double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj))) );
        else if ( pObj->Type == WLC_OBJ_ARI_MINUS )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MINUS,    4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SQRT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQRT,    11 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 8 + 5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 2 - 5  );
        else if ( pObj->Type == WLC_OBJ_ARI_SQUARE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQUARE,   5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj))  );
    }
    if ( nCountRange && Vec_IntSize(&p->vNameIds) > 0 )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", Wlc_ObjId(p, pObjRange), 
            Abc_NamStr(p->pManName, Wlc_ObjNameId(p, Wlc_ObjId(p, pObjRange))), Wlc_ObjRange(pObjRange), pObjRange->End, pObjRange->Beg );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n", fTwoSides ? "     Left Share Right":"" );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d", i, Wlc_Names[i], p->nObjs[i] );
        if ( fTwoSides )
        {
            int nTotal = i == WLC_OBJ_PI ? Wlc_NtkCountRealPis(p) : p->nObjs[i];
            printf( "   " );
            printf( "%6d", nObjs[0][i] );
            printf( "%6d", nObjs[0][i]+nObjs[1][i]-nTotal );
            printf( "%6d", nObjs[1][i] );
        }
        printf( "%8d ", Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Wlc_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Wlc_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
            {
                printf( "\n                                " );
                if ( fTwoSides )
                    printf( "                     " );
            }
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}